

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn_graph.h
# Opt level: O0

void __thiscall gnns::Knn_Graph<L2Distance<float>_>::~Knn_Graph(Knn_Graph<L2Distance<float>_> *this)

{
  uint *puVar1;
  float *pfVar2;
  Knn_Graph<L2Distance<float>_> *this_local;
  
  puVar1 = Matrix<unsigned_int>::ptr(&this->indices);
  if ((puVar1 != (uint *)0x0) &&
     (puVar1 = Matrix<unsigned_int>::ptr(&this->indices), puVar1 != (uint *)0x0)) {
    operator_delete__(puVar1);
  }
  pfVar2 = Matrix<float>::ptr(&this->distances);
  if ((pfVar2 != (float *)0x0) &&
     (pfVar2 = Matrix<float>::ptr(&this->distances), pfVar2 != (float *)0x0)) {
    operator_delete__(pfVar2);
  }
  return;
}

Assistant:

~Knn_Graph()
        {
            if(indices.ptr())
                delete[] indices.ptr();
            if(distances.ptr())
                delete[] distances.ptr();
        }